

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

void __thiscall
dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch
          (CFGStructurizer *this,CFGNode *dominator,CFGNode *from,CFGNode *to)

{
  long lVar1;
  ulong uVar2;
  Vector<CFGNode_*> *__range2;
  __node_base *p_Var3;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  __i;
  pointer ppCVar4;
  pointer ppCVar5;
  Vector<CFGNode_*> linear_visitation_cache;
  CFGNode *n;
  UnorderedSet<CFGNode_*> visitation_cache;
  UnorderedSet<CFGNode_*> *in_stack_ffffffffffffff78;
  pointer ppCVar6;
  value_type local_70;
  _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  if (from != to) {
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    p_Var3 = &local_68._M_before_begin;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0>
              (this,dominator,dominator,from,to,(anon_class_1_0_00000001 *)&local_68,
               in_stack_ffffffffffffff78);
    CFGNode::fixup_merge_info_after_branch_rewrite(dominator,from,to);
    ppCVar5 = (pointer)0x0;
    std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::reserve
              ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
               &stack0xffffffffffffff78,local_68._M_element_count);
    while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
      local_70 = *(value_type *)(p_Var3 + 1);
      if ((CFGNode *)((_Hash_node_base *)((long)local_70 + 0x120))->_M_nxt == from) {
        if (((_Hash_node_base *)((long)local_70 + 0x158))->_M_nxt ==
            ((_Hash_node_base *)((long)local_70 + 0x160))->_M_nxt) {
          ((_Hash_node_base *)((long)local_70 + 0x120))->_M_nxt = (_Hash_node_base *)0x0;
          std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
          push_back((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     *)&stack0xffffffffffffff78,&local_70);
        }
        else {
          ((_Hash_node_base *)((long)local_70 + 0x120))->_M_nxt = (_Hash_node_base *)to;
        }
      }
    }
    if (ppCVar5 != (pointer)0x0) {
      uVar2 = -(long)ppCVar5 >> 3;
      lVar1 = 0x3f;
      if (uVar2 != 0) {
        for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      ppCVar6 = ppCVar5;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0>(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0_const&)::_lambda(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)_1_>>
                (ppCVar5,0,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      if (-(long)ppCVar5 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0>(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0_const&)::_lambda(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)_1_>>
                  (ppCVar5,0);
        ppCVar5 = ppCVar6;
      }
      else {
        ppCVar4 = ppCVar5 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0>(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0_const&)::_lambda(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)_1_>>
                  (ppCVar5,ppCVar4);
        ppCVar5 = ppCVar6;
        for (; ppCVar4 != (pointer)0x0; ppCVar4 = ppCVar4 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Val_comp_iter<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0>(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0_const&)::_lambda(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)_1_>>
                    (ppCVar4);
        }
      }
    }
    for (; ppCVar5 != (pointer)0x0; ppCVar5 = ppCVar5 + 1) {
      if ((*ppCVar5)->immediate_post_dominator == (CFGNode *)0x0) {
        CFGNode::recompute_immediate_post_dominator(*ppCVar5);
      }
    }
    CFGNode::recompute_immediate_post_dominator(dominator);
    std::_Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
    ~_Vector_base((_Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   *)&stack0xffffffffffffff78);
    std::
    _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
  }
  return;
}

Assistant:

void CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch(CFGNode *dominator, CFGNode *from, CFGNode *to,
                                                                   const Op &op)
{
	if (from == to)
		return;

	UnorderedSet<CFGNode *> visitation_cache;
	traverse_dominated_blocks_and_rewrite_branch(dominator, dominator, from, to, op, visitation_cache);
	dominator->fixup_merge_info_after_branch_rewrite(from, to);

	// Force all post-domination information to be recomputed.
	Vector<CFGNode *> linear_visitation_cache;
	linear_visitation_cache.reserve(visitation_cache.size());

	for (auto *n : visitation_cache)
	{
		if (n->immediate_post_dominator == from)
		{
			if (n->fake_succ.empty())
			{
				n->immediate_post_dominator = nullptr;
				// Ignore any infinite continue blocks.
				// They wreak havoc in post-dominance analysis.
				linear_visitation_cache.push_back(n);
			}
			else
			{
				// Infinite loop blocks must not be traversed again.
				n->immediate_post_dominator = to;
			}
		}
	}

	// Will recompute everything that was cleared out.
	// Compute later nodes first. This way we avoid a potential recursive loop.
	std::sort(linear_visitation_cache.begin(), linear_visitation_cache.end(), [](const CFGNode *a, const CFGNode *b) {
		return a->forward_post_visit_order < b->forward_post_visit_order;
	});

	for (auto *n : linear_visitation_cache)
		if (!n->immediate_post_dominator)
			n->recompute_immediate_post_dominator();
	dominator->recompute_immediate_post_dominator();
}